

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

space_info * ghc::filesystem::space(space_info *__return_storage_ptr__,path *p,error_code *ec)

{
  int iVar1;
  value_type *__file;
  error_code eVar2;
  undefined4 uStack_94;
  undefined1 local_88 [8];
  statvfs sfs;
  error_code *ec_local;
  path *p_local;
  
  sfs.__f_spare._16_8_ = ec;
  std::error_code::clear(ec);
  __file = path::c_str(p);
  iVar1 = statvfs(__file,(statvfs *)local_88);
  if (iVar1 == 0) {
    __return_storage_ptr__->capacity = sfs.f_frsize * sfs.f_bsize;
    __return_storage_ptr__->free = sfs.f_blocks * sfs.f_bsize;
    __return_storage_ptr__->available = sfs.f_bfree * sfs.f_bsize;
  }
  else {
    eVar2 = detail::make_system_error(0);
    *(ulong *)sfs.__f_spare._16_8_ = CONCAT44(uStack_94,eVar2._M_value);
    *(error_category **)(sfs.__f_spare._16_8_ + 8) = eVar2._M_cat;
    __return_storage_ptr__->capacity = 0xffffffffffffffff;
    __return_storage_ptr__->free = 0xffffffffffffffff;
    __return_storage_ptr__->available = 0xffffffffffffffff;
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE space_info space(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    ULARGE_INTEGER freeBytesAvailableToCaller = {{ 0, 0 }};
    ULARGE_INTEGER totalNumberOfBytes = {{ 0, 0 }};
    ULARGE_INTEGER totalNumberOfFreeBytes = {{ 0, 0 }};
    if (!GetDiskFreeSpaceExW(GHC_NATIVEWP(p), &freeBytesAvailableToCaller, &totalNumberOfBytes, &totalNumberOfFreeBytes)) {
        ec = detail::make_system_error();
        return {static_cast<uintmax_t>(-1), static_cast<uintmax_t>(-1), static_cast<uintmax_t>(-1)};
    }
    return {static_cast<uintmax_t>(totalNumberOfBytes.QuadPart), static_cast<uintmax_t>(totalNumberOfFreeBytes.QuadPart), static_cast<uintmax_t>(freeBytesAvailableToCaller.QuadPart)};
#else
    struct ::statvfs sfs;
    if (::statvfs(p.c_str(), &sfs) != 0) {
        ec = detail::make_system_error();
        return {static_cast<uintmax_t>(-1), static_cast<uintmax_t>(-1), static_cast<uintmax_t>(-1)};
    }
    return {static_cast<uintmax_t>(sfs.f_blocks * sfs.f_frsize), static_cast<uintmax_t>(sfs.f_bfree * sfs.f_frsize), static_cast<uintmax_t>(sfs.f_bavail * sfs.f_frsize)};
#endif
}